

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O0

void __thiscall
jrtplib::RTCPScheduler::RTCPScheduler(RTCPScheduler *this,RTPSources *s,RTPRandom *r)

{
  RTPRandom *r_local;
  RTPSources *s_local;
  RTCPScheduler *this_local;
  
  this->sources = s;
  RTCPSchedulerParams::RTCPSchedulerParams(&this->schedparams);
  RTPTime::RTPTime(&this->nextrtcptime,0,0);
  RTPTime::RTPTime(&this->prevrtcptime,0,0);
  this->rtprand = r;
  Reset(this);
  return;
}

Assistant:

RTCPScheduler::RTCPScheduler(RTPSources &s, RTPRandom &r) : sources(s),nextrtcptime(0,0),prevrtcptime(0,0),rtprand(r)
{
	Reset();

	//std::cout << (void *)(&rtprand) << std::endl;
}